

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Edge::Edge(Edge *this)

{
  Edge *this_local;
  
  this->rule_ = (Rule *)0x0;
  this->pool_ = (Pool *)0x0;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->inputs_);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->outputs_);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector(&this->validations_);
  this->dyndep_ = (Node *)0x0;
  this->env_ = (BindingEnv *)0x0;
  this->mark_ = VisitNone;
  this->id_ = 0;
  this->outputs_ready_ = false;
  this->deps_loaded_ = false;
  this->deps_missing_ = false;
  this->generated_by_dep_loader_ = false;
  this->implicit_deps_ = 0;
  this->order_only_deps_ = 0;
  this->implicit_outs_ = 0;
  return;
}

Assistant:

Edge()
      : rule_(NULL), pool_(NULL), dyndep_(NULL), env_(NULL), mark_(VisitNone),
        id_(0), outputs_ready_(false), deps_loaded_(false),
        deps_missing_(false), generated_by_dep_loader_(false),
        implicit_deps_(0), order_only_deps_(0), implicit_outs_(0) {}